

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall State::~State(State *this)

{
  vector<Ball,_std::allocator<Ball>_> *in_stack_00000010;
  
  std::vector<Ball,_std::allocator<Ball>_>::~vector(in_stack_00000010);
  return;
}

Assistant:

State() {
        incppect::getInstance().var("state.dt", [this](const auto & idxs) { return incppect::view(dt); });

        incppect::getInstance().var("state.nballs", [this](const auto & idxs) {
            static int n = 0;
            n = balls.size();
            return incppect::view(n);
        });

        incppect::getInstance().var("state.dt", [this](const auto & idxs) { return incppect::view(dt); });
        incppect::getInstance().var("state.energy", [this](const auto & idxs) { return incppect::view(energy); });

        incppect::getInstance().var("state.ball[%d].r", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].r); });
        incppect::getInstance().var("state.ball[%d].m", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].m); });
        incppect::getInstance().var("state.ball[%d].x", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].x); });
        incppect::getInstance().var("state.ball[%d].y", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].y); });
        incppect::getInstance().var("state.ball[%d].z", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].z); });
        incppect::getInstance().var("state.ball[%d].vx", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vx); });
        incppect::getInstance().var("state.ball[%d].vy", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vy); });
        incppect::getInstance().var("state.ball[%d].vz", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vz); });
    }